

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PDynArray * NewDynArray(PType *type)

{
  size_t in_RAX;
  PDynArray *this;
  size_t bucket;
  size_t local_18;
  
  local_18 = in_RAX;
  this = (PDynArray *)
         FTypeTable::FindType
                   (&TypeTable,PDynArray::RegistrationInfo.MyClass,(intptr_t)type,0,&local_18);
  if (this == (PDynArray *)0x0) {
    this = (PDynArray *)
           M_Malloc_Dbg(0x88,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobject.h"
                        ,0x1f7);
    PType::PType((PType *)this);
    (this->super_PCompoundType).super_PType.super_DObject._vptr_DObject =
         (_func_int **)&PTR_StaticType_00846f98;
    this->ElementType = type;
    *(undefined8 *)&(this->super_PCompoundType).super_PType.super_DObject.field_0x24 = 0x800000010;
    FTypeTable::AddType(&TypeTable,(PType *)this,PDynArray::RegistrationInfo.MyClass,(intptr_t)type,
                        0,local_18);
  }
  return this;
}

Assistant:

PDynArray *NewDynArray(PType *type)
{
	size_t bucket;
	PType *atype = TypeTable.FindType(RUNTIME_CLASS(PDynArray), (intptr_t)type, 0, &bucket);
	if (atype == NULL)
	{
		atype = new PDynArray(type);
		TypeTable.AddType(atype, RUNTIME_CLASS(PDynArray), (intptr_t)type, 0, bucket);
	}
	return (PDynArray *)atype;
}